

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deMemPool.c
# Opt level: O1

deMemPool * deMemPool_create(deMemPool *parent)

{
  deMemPoolUtil *pdVar1;
  deMemPool *pdVar2;
  
  pdVar2 = createPoolInternal(parent);
  if ((pdVar2 == (deMemPool *)0x0) && (pdVar1 = parent->util, pdVar1 != (deMemPoolUtil *)0x0)) {
    (*pdVar1->allocFailCallback)(pdVar1->userPointer);
  }
  return pdVar2;
}

Assistant:

deMemPool* deMemPool_create (deMemPool* parent)
{
	deMemPool* pool;
	DE_ASSERT(parent);
	pool = createPoolInternal(parent);
	if (!pool && parent->util)
		parent->util->allocFailCallback(parent->util->userPointer);
	return pool;
}